

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void print_utf8(unsigned_long val)

{
  bool bVar1;
  ostream *poVar2;
  byte *pbVar3;
  unsigned_long uVar4;
  unsigned_long in_RDX;
  int in_R8D;
  bool local_d1;
  size_t sStack_d0;
  bool error;
  size_t pos;
  undefined1 local_c0 [8];
  string utf8;
  char *ch;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  undefined1 local_30 [8];
  string result;
  unsigned_long val_local;
  
  result.field_2._8_8_ = val;
  QUtil::toUTF8_abi_cxx11_((string *)local_30,(QUtil *)val,in_RDX);
  poVar2 = std::operator<<((ostream *)&std::cout,"0x");
  QUtil::uint_to_string_base_abi_cxx11_
            ((string *)&__range2,(QUtil *)result.field_2._8_8_,0x10,0,in_R8D);
  poVar2 = std::operator<<(poVar2,(string *)&__range2);
  std::operator<<(poVar2," ->");
  std::__cxx11::string::~string((string *)&__range2);
  if ((ulong)result.field_2._8_8_ < 0xfffe) {
    poVar2 = std::operator<<((ostream *)&std::cout," ");
    std::operator<<(poVar2,(string *)local_30);
  }
  else {
    __end2._M_current = (char *)std::__cxx11::string::begin();
    ch = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&ch), bVar1) {
      pbVar3 = (byte *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&__end2);
      poVar2 = std::operator<<((ostream *)&std::cout," ");
      QUtil::int_to_string_base_abi_cxx11_
                ((string *)((long)&utf8.field_2 + 8),(QUtil *)(ulong)*pbVar3,0x10,2,in_R8D);
      std::operator<<(poVar2,(string *)(utf8.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(utf8.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,anon_var_dwarf_5ec9,(allocator<char> *)((long)&pos + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
  sStack_d0 = 0;
  local_d1 = false;
  uVar4 = QUtil::get_next_utf8_codepoint((string *)local_c0,&stack0xffffffffffffff30,&local_d1);
  if (uVar4 != 0x3c0) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x3c0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xe9,"void print_utf8(unsigned long)");
  }
  if (sStack_d0 != 2) {
    __assert_fail("pos == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xea,"void print_utf8(unsigned long)");
  }
  if (((local_d1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!error",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xeb,"void print_utf8(unsigned long)");
  }
  uVar4 = QUtil::get_next_utf8_codepoint((string *)local_c0,&stack0xffffffffffffff30,&local_d1);
  if (uVar4 != 0xfffd) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xec,"void print_utf8(unsigned long)");
  }
  if (sStack_d0 != 3) {
    __assert_fail("pos == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xed,"void print_utf8(unsigned long)");
  }
  if ((local_d1 & 1U) == 0) {
    __assert_fail("error",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xee,"void print_utf8(unsigned long)");
  }
  uVar4 = QUtil::get_next_utf8_codepoint((string *)local_c0,&stack0xffffffffffffff30,&local_d1);
  if (uVar4 != 0x30) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x30",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xef,"void print_utf8(unsigned long)");
  }
  if (sStack_d0 != 4) {
    __assert_fail("pos == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf0,"void print_utf8(unsigned long)");
  }
  if (((local_d1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!error",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf1,"void print_utf8(unsigned long)");
  }
  uVar4 = QUtil::get_next_utf8_codepoint((string *)local_c0,&stack0xffffffffffffff30,&local_d1);
  if (uVar4 != 0xfffd) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf2,"void print_utf8(unsigned long)");
  }
  if (sStack_d0 != 6) {
    __assert_fail("pos == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf3,"void print_utf8(unsigned long)");
  }
  if ((local_d1 & 1U) == 0) {
    __assert_fail("error",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf4,"void print_utf8(unsigned long)");
  }
  uVar4 = QUtil::get_next_utf8_codepoint((string *)local_c0,&stack0xffffffffffffff30,&local_d1);
  if (uVar4 != 0x30) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x30",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf5,"void print_utf8(unsigned long)");
  }
  if (sStack_d0 != 7) {
    __assert_fail("pos == 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf6,"void print_utf8(unsigned long)");
  }
  if (((local_d1 ^ 0xffU) & 1) != 0) {
    uVar4 = QUtil::get_next_utf8_codepoint((string *)local_c0,&stack0xffffffffffffff30,&local_d1);
    if (uVar4 != 0x31) {
      __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x31",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xf8,"void print_utf8(unsigned long)");
    }
    if (sStack_d0 != 8) {
      __assert_fail("pos == 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xf9,"void print_utf8(unsigned long)");
    }
    if (((local_d1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!error",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xfa,"void print_utf8(unsigned long)");
    }
    uVar4 = QUtil::get_next_utf8_codepoint((string *)local_c0,&stack0xffffffffffffff30,&local_d1);
    if (uVar4 != 0xfffd) {
      __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xfb,"void print_utf8(unsigned long)");
    }
    if (sStack_d0 != 9) {
      __assert_fail("pos == 9",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xfc,"void print_utf8(unsigned long)");
    }
    if ((local_d1 & 1U) == 0) {
      __assert_fail("error",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xfd,"void print_utf8(unsigned long)");
    }
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_30);
    return;
  }
  __assert_fail("!error",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                ,0xf7,"void print_utf8(unsigned long)");
}

Assistant:

static void
print_utf8(unsigned long val)
{
    std::string result = QUtil::toUTF8(val);
    std::cout << "0x" << QUtil::uint_to_string_base(val, 16) << " ->";
    if (val < 0xfffe) {
        std::cout << " " << result;
    } else {
        // Emacs has trouble with utf-8 encoding files with characters
        // outside the 16-bit portion, so just show the character
        // values.
        for (auto const& ch: result) {
            std::cout << " "
                      << QUtil::int_to_string_base(
                             static_cast<int>(static_cast<unsigned char>(ch)), 16, 2);
        }
    }
    std::cout << std::endl;

    // Boundary conditions for QUtil::get_next_utf8_codepoint, which is
    // also tested indirectly through test_pdf_unicode.cc.
    std::string utf8 = "\xcf\x80\xcf\x30\xEF\xBF\x30\x31\xcf";
    size_t pos = 0;
    bool error = false;
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x3c0);
    assert(pos == 2);
    assert(!error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd);
    assert(pos == 3);
    assert(error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x30);
    assert(pos == 4);
    assert(!error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd);
    assert(pos == 6);
    assert(error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x30);
    assert(pos == 7);
    assert(!error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x31);
    assert(pos == 8);
    assert(!error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd);
    assert(pos == 9);
    assert(error);
}